

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

WaitCompletionState __thiscall
CorUnix::CSynchData::IsRestOfWaitAllSatisfied(CSynchData *this,WaitingThreadsListNode *pwtlnNode)

{
  int iVar1;
  _ThreadWaitInfo *p_Var2;
  WaitingThreadsListNode *pWVar3;
  byte bVar4;
  bool bVar5;
  WaitCompletionState WVar6;
  CSynchData *this_00;
  int iVar7;
  long lVar8;
  bool local_31 [8];
  bool fIsAbandoned;
  
  bVar4 = (byte)pwtlnNode->dwFlags;
  if ((pwtlnNode->dwFlags & 2) == 0) {
    fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x626);
    fprintf(_stderr,
            "Expression: 0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags), Description: IsRestOfWaitAllSatisfied() called on a normal (non wait all) wait"
           );
    bVar4 = (byte)pwtlnNode->dwFlags;
  }
  if (((this->m_odObjectDomain != SharedObject ^ bVar4) & 1) == 0) {
    fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x62a);
    fprintf(_stderr,
            "Expression: (SharedObject == GetObjectDomain()) == (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags)), Description: WTLN_FLAG_OWNER_OBJECT_IS_SHARED in WaitingThreadsListNode not consistent with target object\'s domain\n"
           );
  }
  WVar6 = WaitMayBeSatisfied;
  if (gPID == pwtlnNode->dwProcessId) {
    p_Var2 = pwtlnNode->ptwiWaitInfo;
    iVar1 = p_Var2->lObjCount;
    if ((long)iVar1 < 1) {
      iVar7 = 0;
    }
    else {
      lVar8 = 0;
      iVar7 = 0;
      do {
        pWVar3 = p_Var2->rgpWTLNodes[lVar8];
        if ((pWVar3->dwFlags & 1) == 0) {
          this_00 = (pWVar3->ptrOwnerObjSynchData).ptr;
        }
        else {
          this_00 = (CSynchData *)SHMPtrToPtr((pWVar3->ptrOwnerObjSynchData).shrid);
        }
        if (pWVar3 == pwtlnNode) {
          if (this_00 != this) {
            fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                    ,0x65b);
            fprintf(_stderr,
                    "Expression: this == psdSynchDataItem, Description: pwtlnNode and pwtlnItem match, but this and psdSynchDataItem don\'t\n"
                   );
          }
          iVar7 = iVar7 + 1;
        }
        else {
          bVar5 = CanWaiterWaitWithoutBlocking(this_00,p_Var2->pthrOwner,local_31);
          iVar7 = iVar7 + (uint)bVar5;
          if (!bVar5) break;
        }
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    WVar6 = (WaitCompletionState)(iVar1 <= iVar7);
  }
  if (PAL_InitializeChakraCoreCalled == false) {
    abort();
  }
  return WVar6;
}

Assistant:

WaitCompletionState CSynchData::IsRestOfWaitAllSatisfied(
        WaitingThreadsListNode * pwtlnNode)
    {
        int iSignaledOrOwnedObjCount = 0; 
        int iTgtCount = 0;
        int i;
        WaitCompletionState wcsWaitCompletionState = WaitIsNotSatisfied;
        CSynchData * psdSynchDataItem = NULL;
        ThreadWaitInfo * ptwiWaitInfo = NULL;

        VALIDATEOBJECT(this);
        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags),
                    "IsRestOfWaitAllSatisfied() called on a normal "
                    "(non wait all) wait");
        _ASSERT_MSG((SharedObject == GetObjectDomain()) == 
                    (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags)),
                    "WTLN_FLAG_OWNER_OBJECT_IS_SHARED in WaitingThreadsListNode "
                    "not consistent with target object's domain\n");

        if(gPID != pwtlnNode->dwProcessId)
        {
            ////////////////////////////
            //
            // Remote Thread Awakening 
            //
            ////////////////////////////
            
            // Cannot determine whether or not the wait all is satisfied from 
            // this process 
            wcsWaitCompletionState = WaitMayBeSatisfied;
            goto IROWAS_exit;            
        }

        ///////////////////////////
        //
        // Local Thread Awakening
        //
        ///////////////////////////
        
        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        iTgtCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iTgtCount; i++)
        {
            WaitingThreadsListNode * pwtlnItem = ptwiWaitInfo->rgpWTLNodes[i];
            bool fRetVal;
            bool fIsAbandoned;

            VALIDATEOBJECT(pwtlnItem);

            if (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnItem->dwFlags))
            {                
                psdSynchDataItem = SharedIDToTypePointer(CSynchData, 
                    pwtlnItem->ptrOwnerObjSynchData.shrid);
            }
            else
            {
                psdSynchDataItem = pwtlnItem->ptrOwnerObjSynchData.ptr;
            }

            VALIDATEOBJECT(psdSynchDataItem);

            if (pwtlnItem == pwtlnNode)
            {
                _ASSERT_MSG (this == psdSynchDataItem,
                             "pwtlnNode and pwtlnItem match, but this "
                             "and psdSynchDataItem don't\n");

                // The target object (the one related to pwtlnNode) is counted as
                // signaled/owned without checking it (also if it is not, as 
                // it normally happens when this method is called)                
                iSignaledOrOwnedObjCount++;                
                continue;
            }

            fRetVal = psdSynchDataItem->CanWaiterWaitWithoutBlocking(
                ptwiWaitInfo->pthrOwner,
                &fIsAbandoned);

            if (fRetVal)
            {
                iSignaledOrOwnedObjCount++;
            }
            else
            {
                break;
            }                
        }

        if (iSignaledOrOwnedObjCount < iTgtCount)
        {
            wcsWaitCompletionState = WaitIsNotSatisfied;
        }
        else
        {
            wcsWaitCompletionState = WaitIsSatisfied;
        }

    IROWAS_exit:        
        TRACE("IsRestOfWaitAllSatisfied() returning %u \n", wcsWaitCompletionState);
        
        return wcsWaitCompletionState;
    }